

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_transaction.cpp
# Opt level: O0

CreateSignatureHashResponseStruct *
cfd::js::api::TransactionStructApi::GetSighash
          (CreateSignatureHashResponseStruct *__return_storage_ptr__,
          GetSighashRequestStruct *request)

{
  GetSighashRequestStruct *this;
  string *in_R8;
  allocator local_129;
  function<cfd::js::api::CreateSignatureHashResponseStruct_(const_cfd::js::api::GetSighashRequestStruct_&)>
  local_128;
  undefined1 local_108 [238];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  GetSighashRequestStruct *pGStack_18;
  anon_class_1_0_00000001 call_func;
  GetSighashRequestStruct *request_local;
  CreateSignatureHashResponseStruct *result;
  
  local_1a = 0;
  pGStack_18 = request;
  CreateSignatureHashResponseStruct::CreateSignatureHashResponseStruct(__return_storage_ptr__);
  this = pGStack_18;
  std::
  function<cfd::js::api::CreateSignatureHashResponseStruct(cfd::js::api::GetSighashRequestStruct_const&)>
  ::
  function<cfd::js::api::TransactionStructApi::GetSighash(cfd::js::api::GetSighashRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::CreateSignatureHashResponseStruct(cfd::js::api::GetSighashRequestStruct_const&)>
              *)local_108,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"GetSighash",&local_129);
  ExecuteStructApi<cfd::js::api::GetSighashRequestStruct,cfd::js::api::CreateSignatureHashResponseStruct>
            ((CreateSignatureHashResponseStruct *)(local_108 + 0x20),(api *)this,
             (GetSighashRequestStruct *)local_108,&local_128,in_R8);
  CreateSignatureHashResponseStruct::operator=
            (__return_storage_ptr__,(CreateSignatureHashResponseStruct *)(local_108 + 0x20));
  CreateSignatureHashResponseStruct::~CreateSignatureHashResponseStruct
            ((CreateSignatureHashResponseStruct *)(local_108 + 0x20));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::
  function<cfd::js::api::CreateSignatureHashResponseStruct_(const_cfd::js::api::GetSighashRequestStruct_&)>
  ::~function((function<cfd::js::api::CreateSignatureHashResponseStruct_(const_cfd::js::api::GetSighashRequestStruct_&)>
               *)local_108);
  return __return_storage_ptr__;
}

Assistant:

CreateSignatureHashResponseStruct TransactionStructApi::GetSighash(
    const GetSighashRequestStruct& request) {
  auto call_func = [](const GetSighashRequestStruct& request)
      -> CreateSignatureHashResponseStruct {  // NOLINT
    CreateSignatureHashResponseStruct response;
    TransactionContext tx(request.tx);
    AddressFactory factory;
    auto utxo_list =
        TransactionStructApiBase::ConvertUtxoList(request.utxos, &factory);
    tx.CollectInputUtxo(utxo_list);

    AddressType addr_type =
        AddressApiBase::ConvertAddressType(request.txin.hash_type);
    OutPoint outpoint(Txid(request.txin.txid), request.txin.vout);
    bool has_taproot = (addr_type == AddressType::kTaprootAddress);
    SigHashType sighashtype = TransactionStructApiBase::ConvertSigHashType(
        request.txin.sighash_type, request.txin.sighash_anyone_can_pay,
        request.txin.sighash_rangeproof, has_taproot);

    Script redeem_script;
    bool is_pubkey = false;
    if (request.txin.key_data.type == "pubkey") {
      is_pubkey = true;
    } else if (request.txin.key_data.type == "redeem_script") {
      redeem_script = Script(request.txin.key_data.hex);
    }

    if (has_taproot) {
      SchnorrPubkey pubkey;
      if (is_pubkey) pubkey = SchnorrPubkey(request.txin.key_data.hex);
      ByteData annex(request.txin.annex);
      uint32_t pos =
          static_cast<uint32_t>(request.txin.code_separator_position);
      ByteData256 tapleaf_hash;
      if (!is_pubkey) {
        TaprootScriptTree tree(redeem_script);
        tapleaf_hash = tree.GetTapLeafHash();
      }
      auto sighash = tx.CreateSignatureHashByTaproot(
          outpoint, sighashtype, (is_pubkey) ? nullptr : &tapleaf_hash,
          (request.txin.code_separator_position < 0) ? nullptr : &pos,
          (annex.IsEmpty()) ? nullptr : &annex);
      response.sighash = sighash.GetHex();
    } else {
      WitnessVersion version = WitnessVersion::kVersion0;
      if ((addr_type == AddressType::kP2pkhAddress) ||
          (addr_type == AddressType::kP2shAddress)) {
        version = WitnessVersion::kVersionNone;
      }
      auto utxo = tx.GetTxInUtxoData(outpoint);
      ByteData sighash;
      if (is_pubkey) {
        Pubkey pubkey(request.txin.key_data.hex);
        sighash = tx.CreateSignatureHash(
            outpoint, pubkey, sighashtype, utxo.amount, version);
      } else {
        sighash = tx.CreateSignatureHash(
            outpoint, redeem_script, sighashtype, utxo.amount, version);
      }
      response.sighash = sighash.GetHex();
    }
    return response;
  };

  CreateSignatureHashResponseStruct result;
  result = ExecuteStructApi<
      GetSighashRequestStruct, CreateSignatureHashResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}